

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O1

Oop __thiscall
Lodtalk::SpecialRuntimeObjects::makeSelector(SpecialRuntimeObjects *this,char *string)

{
  VMContext *this_00;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar1;
  allocator local_31;
  string local_30;
  
  this_00 = this->context;
  std::__cxx11::string::string((string *)&local_30,string,&local_31);
  aVar1 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::makeSelector(this_00,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return (Oop)aVar1.pointer;
}

Assistant:

Oop SpecialRuntimeObjects::makeSelector(const char *string)
{
    return context->makeSelector(string);
}